

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.hpp
# Opt level: O3

void __thiscall
pstore::broker::
message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
::push(message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
       *this,unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             *message)

{
  iterator *piVar1;
  _Elt_pointer puVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mut_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  puVar2 = (this->queue_).c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == (this->queue_).c.
                super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>,std::allocator<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>
              ((deque<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>,std::allocator<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>>
                *)&this->queue_,message);
  }
  else {
    (puVar2->_M_t).
    super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
    .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
         (message->_M_t).
         super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
         .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl;
    (message->_M_t).
    super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
    .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
         (message_type *)0x0;
    piVar1 = &(this->queue_).c.
              super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void message_queue<T>::push (T && message) {
            std::unique_lock<decltype (mut_)> lock (mut_);
            queue_.push (std::move (message));
            cv.notify_one ();
        }